

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBToYRow_SSSE3(uint8_t *src_argb,uint8_t *dst_y,int width)

{
  bool bVar1;
  uvec8 auVar2;
  int iVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  ushort uVar6;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar7 [16];
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar22 [16];
  ushort uVar23;
  ushort uVar24;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ushort uVar39;
  ushort uVar40;
  
  auVar2 = libyuv::kARGBToY;
  do {
    auVar4[0] = *src_argb + 0x80;
    auVar4[1] = src_argb[1] + 0x80;
    auVar4[2] = src_argb[2] + 0x80;
    auVar4[3] = src_argb[3] + 0x80;
    auVar4[4] = src_argb[4] + 0x80;
    auVar4[5] = src_argb[5] + 0x80;
    auVar4[6] = src_argb[6] + 0x80;
    auVar4[7] = src_argb[7] + 0x80;
    auVar4[8] = src_argb[8] + 0x80;
    auVar4[9] = src_argb[9] + 0x80;
    auVar4[10] = src_argb[10] + 0x80;
    auVar4[0xb] = src_argb[0xb] + 0x80;
    auVar4[0xc] = src_argb[0xc] + 0x80;
    auVar4[0xd] = src_argb[0xd] + 0x80;
    auVar4[0xe] = src_argb[0xe] + 0x80;
    auVar4[0xf] = src_argb[0xf] + 0x80;
    auVar7[0] = src_argb[0x10] + 0x80;
    auVar7[1] = src_argb[0x11] + 0x80;
    auVar7[2] = src_argb[0x12] + 0x80;
    auVar7[3] = src_argb[0x13] + 0x80;
    auVar7[4] = src_argb[0x14] + 0x80;
    auVar7[5] = src_argb[0x15] + 0x80;
    auVar7[6] = src_argb[0x16] + 0x80;
    auVar7[7] = src_argb[0x17] + 0x80;
    auVar7[8] = src_argb[0x18] + 0x80;
    auVar7[9] = src_argb[0x19] + 0x80;
    auVar7[10] = src_argb[0x1a] + 0x80;
    auVar7[0xb] = src_argb[0x1b] + 0x80;
    auVar7[0xc] = src_argb[0x1c] + 0x80;
    auVar7[0xd] = src_argb[0x1d] + 0x80;
    auVar7[0xe] = src_argb[0x1e] + 0x80;
    auVar7[0xf] = src_argb[0x1f] + 0x80;
    auVar22[0] = src_argb[0x20] + 0x80;
    auVar22[1] = src_argb[0x21] + 0x80;
    auVar22[2] = src_argb[0x22] + 0x80;
    auVar22[3] = src_argb[0x23] + 0x80;
    auVar22[4] = src_argb[0x24] + 0x80;
    auVar22[5] = src_argb[0x25] + 0x80;
    auVar22[6] = src_argb[0x26] + 0x80;
    auVar22[7] = src_argb[0x27] + 0x80;
    auVar22[8] = src_argb[0x28] + 0x80;
    auVar22[9] = src_argb[0x29] + 0x80;
    auVar22[10] = src_argb[0x2a] + 0x80;
    auVar22[0xb] = src_argb[0x2b] + 0x80;
    auVar22[0xc] = src_argb[0x2c] + 0x80;
    auVar22[0xd] = src_argb[0x2d] + 0x80;
    auVar22[0xe] = src_argb[0x2e] + 0x80;
    auVar22[0xf] = src_argb[0x2f] + 0x80;
    auVar26[0] = src_argb[0x30] + 0x80;
    auVar26[1] = src_argb[0x31] + 0x80;
    auVar26[2] = src_argb[0x32] + 0x80;
    auVar26[3] = src_argb[0x33] + 0x80;
    auVar26[4] = src_argb[0x34] + 0x80;
    auVar26[5] = src_argb[0x35] + 0x80;
    auVar26[6] = src_argb[0x36] + 0x80;
    auVar26[7] = src_argb[0x37] + 0x80;
    auVar26[8] = src_argb[0x38] + 0x80;
    auVar26[9] = src_argb[0x39] + 0x80;
    auVar26[10] = src_argb[0x3a] + 0x80;
    auVar26[0xb] = src_argb[0x3b] + 0x80;
    auVar26[0xc] = src_argb[0x3c] + 0x80;
    auVar26[0xd] = src_argb[0x3d] + 0x80;
    auVar26[0xe] = src_argb[0x3e] + 0x80;
    auVar26[0xf] = src_argb[0x3f] + 0x80;
    auVar25 = pmaddubsw((undefined1  [16])auVar2,auVar4);
    auVar4 = pmaddubsw((undefined1  [16])auVar2,auVar7);
    auVar7 = pmaddubsw((undefined1  [16])auVar2,auVar22);
    auVar22 = pmaddubsw((undefined1  [16])auVar2,auVar26);
    src_argb = src_argb + 0x40;
    auVar26 = phaddw(auVar25,auVar4);
    auVar4 = phaddw(auVar7,auVar22);
    uVar23 = auVar26._0_2_ + 0x7e80;
    uVar27 = auVar26._2_2_ + 0x7e80;
    uVar29 = auVar26._4_2_ + 0x7e80;
    uVar31 = auVar26._6_2_ + 0x7e80;
    uVar33 = auVar26._8_2_ + 0x7e80;
    uVar35 = auVar26._10_2_ + 0x7e80;
    uVar37 = auVar26._12_2_ + 0x7e80;
    uVar39 = auVar26._14_2_ + 0x7e80;
    uVar5 = auVar4._0_2_ + 0x7e80;
    uVar8 = auVar4._2_2_ + 0x7e80;
    uVar10 = auVar4._4_2_ + 0x7e80;
    uVar12 = auVar4._6_2_ + 0x7e80;
    uVar14 = auVar4._8_2_ + 0x7e80;
    uVar16 = auVar4._10_2_ + 0x7e80;
    uVar18 = auVar4._12_2_ + 0x7e80;
    uVar20 = auVar4._14_2_ + 0x7e80;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar30 = uVar29 >> 8;
    uVar32 = uVar31 >> 8;
    uVar34 = uVar33 >> 8;
    uVar36 = uVar35 >> 8;
    uVar38 = uVar37 >> 8;
    uVar40 = uVar39 >> 8;
    uVar6 = uVar5 >> 8;
    uVar9 = uVar8 >> 8;
    uVar11 = uVar10 >> 8;
    uVar13 = uVar12 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    *dst_y = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
    dst_y[1] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
    dst_y[2] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
    dst_y[3] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
    dst_y[4] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    dst_y[5] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
    dst_y[6] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
    dst_y[7] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst_y[8] = (uVar6 != 0) * (uVar6 < 0x100) * (char)(uVar5 >> 8) - (0xff < uVar6);
    dst_y[9] = (uVar9 != 0) * (uVar9 < 0x100) * (char)(uVar8 >> 8) - (0xff < uVar9);
    dst_y[10] = (uVar11 != 0) * (uVar11 < 0x100) * (char)(uVar10 >> 8) - (0xff < uVar11);
    dst_y[0xb] = (uVar13 != 0) * (uVar13 < 0x100) * (char)(uVar12 >> 8) - (0xff < uVar13);
    dst_y[0xc] = (uVar15 != 0) * (uVar15 < 0x100) * (char)(uVar14 >> 8) - (0xff < uVar15);
    dst_y[0xd] = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar16 >> 8) - (0xff < uVar17);
    dst_y[0xe] = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
    dst_y[0xf] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
    dst_y = dst_y + 0x10;
    iVar3 = width + -0x10;
    bVar1 = 0xf < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar1);
  return;
}

Assistant:

void ARGBToYRow_SSSE3(const uint8_t* src_argb, uint8_t* dst_y, int width) {
  asm volatile(
      "movdqa      %3,%%xmm4                     \n"
      "movdqa      %4,%%xmm5                     \n"
      "movdqa      %5,%%xmm7                     \n"

      LABELALIGN RGBTOY(xmm7)
      : "+r"(src_argb),  // %0
        "+r"(dst_y),     // %1
        "+r"(width)      // %2
      : "m"(kARGBToY),   // %3
        "m"(kSub128),    // %4
        "m"(kAddY16)     // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}